

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O1

MatchPattern * __thiscall
pfederc::Parser::parseMatchCase(MatchPattern *__return_storage_ptr__,Parser *this,bool *err)

{
  Token *pTVar1;
  Token *this_00;
  size_t sVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  istream *piVar6;
  bool bVar7;
  _Head_base<0UL,_const_pfederc::Token_*,_false> _Var8;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> vars;
  undefined1 local_90 [8];
  Error<pfederc::SyntaxErrorCode> *local_88;
  iterator iStack_80;
  _Base_ptr local_78;
  Error<pfederc::SyntaxErrorCode> *local_70;
  Token *local_68;
  _Base_ptr local_60;
  undefined1 local_48 [16];
  
  pTVar1 = this->lexer->currentToken;
  bVar7 = Token::operator!=(pTVar1,TOK_ID);
  if ((bVar7) &&
     (this_00 = this->lexer->currentToken, 9 < (ushort)((short)*(undefined4 *)&this_00->type - 6U)))
  {
    bVar7 = Token::operator!=(this_00,TOK_CHAR);
    if (bVar7) {
      bVar7 = Token::operator!=(this->lexer->currentToken,TOK_KW_TRUE);
      if (bVar7) {
        bVar7 = Token::operator!=(this->lexer->currentToken,TOK_KW_FALSE);
        if (bVar7) {
          pTVar1 = this->lexer->currentToken;
          local_88 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
          sVar4 = (pTVar1->pos).line;
          sVar5 = (pTVar1->pos).startIndex;
          sVar2 = (pTVar1->pos).endIndex;
          local_88->logLevel = LVL_ERROR;
          local_88->err = STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL;
          (local_88->pos).line = sVar4;
          (local_88->pos).startIndex = sVar5;
          (local_88->pos).endIndex = sVar2;
          (local_88->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_88->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_88->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError((Parser *)&stack0xffffffffffffffc8,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffc8);
          if (local_88 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_88,
                       local_88);
          }
          bVar7 = Token::operator!=(this->lexer->currentToken,TOK_OP_BRACKET_OPEN);
          if (!bVar7) {
            _Var8._M_head_impl = (Token *)0x0;
            goto LAB_0011861c;
          }
          bVar7 = Token::operator!=(this->lexer->currentToken,TOK_IMPL);
          _Var8._M_head_impl = (Token *)0x0;
          pTVar1 = (Token *)0x0;
          if (!bVar7) goto LAB_0011861c;
        }
      }
    }
  }
  _Var8._M_head_impl = pTVar1;
  Lexer::next(this->lexer);
LAB_0011861c:
  local_88 = (Error<pfederc::SyntaxErrorCode> *)0x0;
  iStack_80._M_current = (Token **)0x0;
  local_78 = (_Base_ptr)0x0;
  bVar7 = expect(this,TOK_OP_BRACKET_OPEN);
  if (bVar7) {
    local_68 = _Var8._M_head_impl;
    local_60 = (_Base_ptr)__return_storage_ptr__;
    do {
      skipEol(this);
      local_90 = (undefined1  [8])this->lexer->currentToken;
      bVar7 = Token::operator!=((Token *)local_90,TOK_ID);
      if (bVar7) {
        bVar7 = Token::operator!=((Token *)local_90,TOK_ANY);
        if (!bVar7) goto LAB_00118729;
        pTVar1 = this->lexer->currentToken;
        local_70 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
        sVar4 = (pTVar1->pos).line;
        sVar5 = (pTVar1->pos).startIndex;
        sVar2 = (pTVar1->pos).endIndex;
        local_70->logLevel = LVL_ERROR;
        local_70->err = STX_ERR_EXPECTED_ID_ANY;
        (local_70->pos).line = sVar4;
        (local_70->pos).startIndex = sVar5;
        (local_70->pos).endIndex = sVar2;
        (local_70->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_70->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_70->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        generateError((Parser *)(local_48 + 8),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 8));
        if (local_70 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_70,local_70
                    );
        }
        bVar7 = Token::operator!=((Token *)local_90,TOK_OP_COMMA);
        if (bVar7) {
          Lexer::next(this->lexer);
        }
      }
      else {
LAB_00118729:
        Lexer::next(this->lexer);
        if ((_Base_ptr)iStack_80._M_current == local_78) {
          std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>::
          _M_realloc_insert<pfederc::Token_const*const&>
                    ((vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>> *)
                     &local_88,iStack_80,(Token **)local_90);
        }
        else {
          *iStack_80._M_current = (Token *)local_90;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      bVar7 = expect(this,TOK_OP_COMMA);
    } while (bVar7);
    bVar7 = expect(this,TOK_BRACKET_CLOSE);
    __return_storage_ptr__ = (MatchPattern *)local_60;
    _Var8._M_head_impl = local_68;
    if (!bVar7) {
      pTVar1 = this->lexer->currentToken;
      local_90 = (undefined1  [8])operator_new(0x38);
      sVar2 = (pTVar1->pos).line;
      piVar6 = (istream *)(pTVar1->pos).startIndex;
      pcVar3 = (pointer)(pTVar1->pos).endIndex;
      *(undefined2 *)local_90 = 2;
      *(SyntaxErrorCode *)((long)local_90 + 4) = STX_ERR_EXPECTED_CLOSING_BRACKET;
      ((Position *)((long)local_90 + 8))->line = sVar2;
      *(istream **)((long)local_90 + 0x10) = piVar6;
      (((string *)((long)local_90 + 0x18))->_M_dataplus)._M_p = pcVar3;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)((long)local_90 + 0x20))->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_90 + 0x28))->_M_allocated_capacity = 0;
      *(pointer *)((long)local_90 + 0x30) = (pointer)0x0;
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      if ((_Head_base<0UL,_pfederc::BodyExpr_*,_false>)local_90 !=
          (_Head_base<0UL,_pfederc::BodyExpr_*,_false>)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_90,
                   (Error<pfederc::SyntaxErrorCode> *)local_90);
      }
    }
  }
  bVar7 = expect(this,TOK_IMPL);
  if (!bVar7) {
    pTVar1 = this->lexer->currentToken;
    local_90 = (undefined1  [8])operator_new(0x38);
    sVar2 = (pTVar1->pos).line;
    piVar6 = (istream *)(pTVar1->pos).startIndex;
    pcVar3 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&((Lexer *)local_90)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_90)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_OP_IMPL;
    ((Position *)&((Lexer *)local_90)->cfg)->line = sVar2;
    ((Lexer *)local_90)->input = piVar6;
    (((Lexer *)local_90)->filePath)._M_dataplus._M_p = pcVar3;
    (((Lexer *)local_90)->filePath)._M_string_length = 0;
    (((Lexer *)local_90)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_90)->filePath).field_2 + 8) = 0;
    generateError((Parser *)&stack0xffffffffffffffb0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffb0);
    if (local_90 != (undefined1  [8])0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_90,
                 (Error<pfederc::SyntaxErrorCode> *)local_90);
    }
  }
  skipEol(this);
  parseFunctionBody((Parser *)local_90);
  bVar7 = expect(this,TOK_STMT);
  if (!bVar7) {
    pTVar1 = this->lexer->currentToken;
    local_70 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar4 = (pTVar1->pos).line;
    sVar5 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    local_70->logLevel = LVL_ERROR;
    local_70->err = STX_ERR_EXPECTED_STMT;
    (local_70->pos).line = sVar4;
    (local_70->pos).startIndex = sVar5;
    (local_70->pos).endIndex = sVar2;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffa8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa8);
    if (local_70 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_70,local_70);
    }
  }
  skipEol(this);
  *(undefined1 (*) [8])__return_storage_ptr__ = local_90;
  local_90 = (undefined1  [8])0x0;
  (((_Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
     *)&((_Base_ptr)__return_storage_ptr__)->_M_parent)->_M_head_impl).
  super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88;
  ((_Base_ptr)__return_storage_ptr__)->_M_left = (_Base_ptr)iStack_80._M_current;
  ((_Base_ptr)__return_storage_ptr__)->_M_right = local_78;
  local_78 = (_Base_ptr)0x0;
  local_88 = (Error<pfederc::SyntaxErrorCode> *)0x0;
  iStack_80._M_current = (Token **)0x0;
  *(Token **)((long)__return_storage_ptr__ + 0x20) = _Var8._M_head_impl;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_90);
  if (local_88 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return (MatchPattern *)(_Base_ptr)__return_storage_ptr__;
}

Assistant:

MatchPattern Parser::parseMatchCase(bool &err) noexcept {
  const Token *tokId = lexer.getCurrentToken();
  if (*lexer.getCurrentToken() != TokenType::TOK_ID
      && !isNumberType(lexer.getCurrentToken()->getType())
      && *lexer.getCurrentToken() != TokenType::TOK_CHAR
      && *lexer.getCurrentToken() != TokenType::TOK_KW_TRUE
      && *lexer.getCurrentToken() != TokenType::TOK_KW_FALSE) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL,
          lexer.getCurrentToken()->getPosition()));
    if (*lexer.getCurrentToken()  != TokenType::TOK_OP_BRACKET_OPEN
        && *lexer.getCurrentToken() != TokenType::TOK_IMPL)
      lexer.next(); // skip
    tokId = nullptr;
  } else {
    lexer.next();
  }

  std::vector<const Token *> vars;
  if (expect(TokenType::TOK_OP_BRACKET_OPEN)) {
    do {
      skipEol();
      const Token *const tokVarId = lexer.getCurrentToken();
      if (*tokVarId != TokenType::TOK_ID && *tokVarId != TokenType::TOK_ANY) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_EXPECTED_ID_ANY,
              lexer.getCurrentToken()->getPosition()));
        if (*tokVarId != TokenType::TOK_OP_COMMA)
          lexer.next();
      } else {
        lexer.next(); // eat id|any

        vars.push_back(tokVarId);
      }
    } while (expect(TokenType::TOK_OP_COMMA));

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
            lexer.getCurrentToken()->getPosition()));
    }
  }

  if (!expect(TokenType::TOK_IMPL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_OP_IMPL,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  return MatchPattern(tokId, std::move(vars), std::move(bodyExpr));
}